

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

void __thiscall
Lodtalk::MethodCompiler::MethodCompiler(MethodCompiler *this,VMContext *context,Oop classBinding)

{
  (this->super_AbstractASTVisitor).super_ASTVisitor._vptr_ASTVisitor =
       (_func_int **)&PTR_visitArgument_00163958;
  this->context = context;
  (this->selector).oop.field_0.pointer = (uint8_t *)&NilObject;
  (this->selector).context_ = context;
  OopRef::registerSelf(&this->selector);
  (this->additionalMethodState).reference.oop.field_0.pointer = (uint8_t *)&NilObject;
  (this->additionalMethodState).reference.context_ = context;
  OopRef::registerSelf(&(this->additionalMethodState).reference);
  (this->classBinding).oop.field_0 = classBinding.field_0;
  (this->classBinding).context_ = context;
  OopRef::registerSelf(&this->classBinding);
  MethodAssembler::Assembler::Assembler(&this->gen,context);
  return;
}

Assistant:

MethodCompiler(VMContext *context, Oop classBinding)
		: context(context), selector(context), additionalMethodState(context), classBinding(context, classBinding), gen(context) {}